

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

Hashtable * getCurrSymbolsEquiv(void)

{
  ushort uVar1;
  Key key;
  uint ch;
  UHashtable *pUVar2;
  UnicodeSetStringSpan *pUVar3;
  UBool UVar4;
  UnicodeSetStringSpan *this;
  UVector *pUVar5;
  UnicodeSet *pUVar6;
  UnicodeSet *that;
  UnicodeSet *this_00;
  UnicodeSet *this_01;
  UnicodeString *this_02;
  UnicodeString *this_03;
  UnicodeString *this_04;
  int iVar7;
  int iVar8;
  code *pcVar9;
  bool bVar10;
  UnicodeString exemplar;
  EquivIterator leftIter;
  UnicodeSetIterator it;
  UErrorCode local_12c;
  undefined1 local_128 [64];
  UVector *local_e8;
  EquivIterator local_e0;
  EquivIterator local_c8;
  undefined1 local_b0 [64];
  UnicodeSetIterator local_70;
  
  if (gCurrSymbolsEquivInitOnce.fState.super___atomic_base<int>._M_i == 2) {
    return gCurrSymbolsEquiv;
  }
  UVar4 = icu_63::umtx_initImplPreInit(&gCurrSymbolsEquivInitOnce);
  if (UVar4 == '\0') {
    return gCurrSymbolsEquiv;
  }
  local_12c = U_ZERO_ERROR;
  pcVar9 = currency_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  this = (UnicodeSetStringSpan *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pcVar9);
  pUVar3 = (UnicodeSetStringSpan *)gCurrSymbolsEquiv;
  if (this == (UnicodeSetStringSpan *)0x0) goto LAB_002b04d9;
  *(undefined8 *)this = 0;
  pUVar6 = &this->spanSet;
  pcVar9 = uhash_hashUnicodeString_63;
  uhash_init_63((UHashtable *)pUVar6,uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,
                (undefined1 *)0x0,&local_12c);
  if (local_12c < U_ILLEGAL_ARGUMENT_ERROR) {
    *(UnicodeSet **)this = pUVar6;
    pcVar9 = uprv_deleteUObject_63;
    uhash_setKeyDeleter_63((UHashtable *)pUVar6,uprv_deleteUObject_63);
    if (U_ZERO_ERROR < local_12c) goto LAB_002b04c4;
    pcVar9 = deleteUnicode;
    uhash_setValueDeleter_63(*(UHashtable **)this,deleteUnicode);
    if (local_12c < U_ILLEGAL_ARGUMENT_ERROR) {
      pUVar5 = (UVector *)0x0;
      do {
        key = *(Key *)&pUVar5[0x14b7a].super_UObject._vptr_UObject;
        ch = *(uint *)((long)&pUVar5[0x14b7a].super_UObject._vptr_UObject + 4);
        pcVar9 = (code *)(ulong)ch;
        local_e8 = pUVar5;
        icu_63::UnicodeString::UnicodeString((UnicodeString *)local_128,ch);
        pUVar6 = icu_63::unisets::get(key);
        if (pUVar6 == (UnicodeSet *)0x0) {
LAB_002b0977:
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_128);
          break;
        }
        icu_63::UnicodeSetIterator::UnicodeSetIterator(&local_70,pUVar6);
        pcVar9 = (code *)pUVar6;
        while( true ) {
          pUVar6 = (UnicodeSet *)local_128;
          UVar4 = icu_63::UnicodeSetIterator::next(&local_70);
          if (UVar4 == '\0') break;
          pcVar9 = (code *)icu_63::UnicodeSetIterator::getString(&local_70);
          icu_63::UnicodeString::UnicodeString((UnicodeString *)local_b0,(UnicodeString *)pcVar9);
          if ((local_b0._8_2_ & 1) == 0) {
            iVar8 = local_b0._12_4_;
            if (-1 < (short)local_b0._8_2_) {
              iVar8 = (int)(short)local_b0._8_2_ >> 5;
            }
            iVar7 = local_128._12_4_;
            if (-1 < (short)local_128._8_2_) {
              iVar7 = (int)(short)local_128._8_2_ >> 5;
            }
            if ((((int)(short)local_128._8_2_ & 1U) == 0) && (iVar8 == iVar7)) {
              UVar4 = icu_63::UnicodeString::doEquals
                                ((UnicodeString *)local_b0,(UnicodeString *)pUVar6,iVar8);
              bVar10 = UVar4 != '\0';
              pcVar9 = (code *)pUVar6;
              goto LAB_002b05ee;
            }
LAB_002b05f6:
            if (local_12c < U_ILLEGAL_ARGUMENT_ERROR) {
              if ((local_128._8_2_ & 1) == 0) {
                iVar8 = local_128._12_4_;
                if (-1 < (short)local_128._8_2_) {
                  iVar8 = (int)(short)local_128._8_2_ >> 5;
                }
                iVar7 = local_b0._12_4_;
                if (-1 < (short)local_b0._8_2_) {
                  iVar7 = (int)(short)local_b0._8_2_ >> 5;
                }
                if ((((int)(short)local_b0._8_2_ & 1U) == 0) && (iVar8 == iVar7)) {
                  pcVar9 = (code *)local_b0;
                  UVar4 = icu_63::UnicodeString::doEquals
                                    ((UnicodeString *)local_128,(UnicodeString *)local_b0,iVar8);
                  bVar10 = UVar4 != '\0';
                  goto LAB_002b065e;
                }
LAB_002b0666:
                local_c8._start = (UnicodeString *)local_128;
                local_e0._hash = (Hashtable *)this;
                local_e0._start = (UnicodeString *)local_b0;
                local_e0._current = (UnicodeString *)local_b0;
                local_c8._hash = (Hashtable *)this;
                local_c8._current = local_c8._start;
                pUVar6 = (UnicodeSet *)icu_63::EquivIterator::next(&local_c8);
                that = (UnicodeSet *)icu_63::EquivIterator::next(&local_e0);
                this_01 = that;
                this_00 = pUVar6;
                if (that != (UnicodeSet *)0x0 && pUVar6 != (UnicodeSet *)0x0) {
                  do {
                    uVar1 = *(ushort *)
                             &(this_00->super_UnicodeFilter).super_UnicodeMatcher.
                              _vptr_UnicodeMatcher;
                    if ((uVar1 & 1) == 0) {
                      if ((short)uVar1 < 0) {
                        iVar8 = *(int *)((long)&(this_00->super_UnicodeFilter).super_UnicodeMatcher.
                                                _vptr_UnicodeMatcher + 4);
                      }
                      else {
                        iVar8 = (int)(short)uVar1 >> 5;
                      }
                      iVar7 = local_b0._12_4_;
                      if (-1 < (short)local_b0._8_2_) {
                        iVar7 = (int)(short)local_b0._8_2_ >> 5;
                      }
                      if ((((int)(short)local_b0._8_2_ & 1U) == 0) && (iVar8 == iVar7)) {
                        pcVar9 = (code *)local_b0;
                        UVar4 = icu_63::UnicodeString::doEquals
                                          ((UnicodeString *)this_00,(UnicodeString *)local_b0,iVar8)
                        ;
                        bVar10 = UVar4 != '\0';
                        goto LAB_002b0713;
                      }
                    }
                    else {
                      bVar10 = (bool)(local_b0[8] & 1);
LAB_002b0713:
                      if (bVar10 != false) goto LAB_002b0918;
                    }
                    uVar1 = *(ushort *)
                             &(this_01->super_UnicodeFilter).super_UnicodeMatcher.
                              _vptr_UnicodeMatcher;
                    if ((uVar1 & 1) == 0) {
                      if ((short)uVar1 < 0) {
                        iVar8 = *(int *)((long)&(this_01->super_UnicodeFilter).super_UnicodeMatcher.
                                                _vptr_UnicodeMatcher + 4);
                      }
                      else {
                        iVar8 = (int)(short)uVar1 >> 5;
                      }
                      iVar7 = local_128._12_4_;
                      if (-1 < (short)local_128._8_2_) {
                        iVar7 = (int)(short)local_128._8_2_ >> 5;
                      }
                      if ((((int)(short)local_128._8_2_ & 1U) == 0) && (iVar8 == iVar7)) {
                        pcVar9 = (code *)local_128;
                        UVar4 = icu_63::UnicodeString::doEquals
                                          ((UnicodeString *)this_01,(UnicodeString *)pcVar9,iVar8);
                        bVar10 = UVar4 != '\0';
                        goto LAB_002b076c;
                      }
                    }
                    else {
                      bVar10 = (bool)(local_128[8] & 1);
LAB_002b076c:
                      if (bVar10 != false) goto LAB_002b0918;
                    }
                    this_00 = (UnicodeSet *)icu_63::EquivIterator::next(&local_c8);
                    this_01 = (UnicodeSet *)icu_63::EquivIterator::next(&local_e0);
                  } while ((this_00 != (UnicodeSet *)0x0) && (this_01 != (UnicodeSet *)0x0));
                }
                this_02 = (UnicodeString *)
                          icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar9);
                if (pUVar6 == (UnicodeSet *)0x0 && that == (UnicodeSet *)0x0) {
                  if (this_02 != (UnicodeString *)0x0) {
                    pcVar9 = (code *)local_b0;
                    icu_63::UnicodeString::UnicodeString(this_02,(UnicodeString *)local_b0);
                  }
                  this_03 = (UnicodeString *)
                            icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar9);
                  if (this_03 == (UnicodeString *)0x0) goto LAB_002b08f7;
                  pUVar6 = (UnicodeSet *)local_128;
                  icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)pUVar6);
LAB_002b0888:
                  if (this_02 != (UnicodeString *)0x0) {
                    pUVar2 = *(UHashtable **)this;
                    this_04 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pUVar6);
                    if (this_04 != (UnicodeString *)0x0) {
                      icu_63::UnicodeString::UnicodeString(this_04,(UnicodeString *)local_128);
                    }
                    uhash_put_63(pUVar2,this_04,this_02,&local_12c);
                    pUVar2 = *(UHashtable **)this;
                    pcVar9 = (code *)icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)this_04);
                    if ((UnicodeSet *)pcVar9 != (UnicodeSet *)0x0) {
                      icu_63::UnicodeString::UnicodeString
                                ((UnicodeString *)pcVar9,(UnicodeString *)local_b0);
                    }
                    uhash_put_63(pUVar2,pcVar9,this_03,&local_12c);
                    goto LAB_002b0918;
                  }
LAB_002b0901:
                  (*(this_03->super_Replaceable).super_UObject._vptr_UObject[1])(this_03);
                  pcVar9 = (code *)pUVar6;
                }
                else {
                  if (that == (UnicodeSet *)0x0) {
                    if (this_02 != (UnicodeString *)0x0) {
                      pcVar9 = (code *)local_b0;
                      icu_63::UnicodeString::UnicodeString(this_02,(UnicodeString *)local_b0);
                    }
                    this_03 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar9);
                    if (this_03 == (UnicodeString *)0x0) goto LAB_002b08f7;
                    icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)pUVar6);
                    goto LAB_002b0888;
                  }
                  if (pUVar6 == (UnicodeSet *)0x0) {
                    if (this_02 != (UnicodeString *)0x0) {
                      icu_63::UnicodeString::UnicodeString(this_02,(UnicodeString *)that);
                      pcVar9 = (code *)that;
                    }
                    this_03 = (UnicodeString *)
                              icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar9);
                    if (this_03 == (UnicodeString *)0x0) goto LAB_002b08f7;
                    pUVar6 = (UnicodeSet *)local_128;
                    icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)pUVar6);
                    goto LAB_002b0888;
                  }
                  if (this_02 != (UnicodeString *)0x0) {
                    icu_63::UnicodeString::UnicodeString(this_02,(UnicodeString *)that);
                    pcVar9 = (code *)that;
                  }
                  this_03 = (UnicodeString *)
                            icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar9);
                  if (this_03 != (UnicodeString *)0x0) {
                    icu_63::UnicodeString::UnicodeString(this_03,(UnicodeString *)pUVar6);
                    goto LAB_002b0888;
                  }
LAB_002b08f7:
                  pUVar6 = (UnicodeSet *)pcVar9;
                  this_03 = this_02;
                  if (this_02 != (UnicodeString *)0x0) goto LAB_002b0901;
                }
                local_12c = U_MEMORY_ALLOCATION_ERROR;
              }
              else {
                bVar10 = (bool)(local_b0[8] & 1);
LAB_002b065e:
                if (bVar10 == false) goto LAB_002b0666;
              }
LAB_002b0918:
              if (local_12c < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002b091f;
            }
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
            icu_63::UnicodeSetIterator::~UnicodeSetIterator(&local_70);
            goto LAB_002b0977;
          }
          bVar10 = (bool)(local_128[8] & 1);
LAB_002b05ee:
          if (bVar10 == false) goto LAB_002b05f6;
LAB_002b091f:
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b0);
        }
        icu_63::UnicodeSetIterator::~UnicodeSetIterator(&local_70);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)pUVar6);
        pUVar5 = (UVector *)&local_e8->count;
      } while (pUVar5 != (UVector *)0x20);
      pUVar3 = this;
      if (local_12c < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002b04d9;
    }
    if (*(UHashtable **)this != (UHashtable *)0x0) {
      uhash_close_63(*(UHashtable **)this);
    }
  }
  else {
LAB_002b04c4:
    if (*(UHashtable **)this != (UHashtable *)0x0) {
      uhash_close_63(*(UHashtable **)this);
    }
  }
  icu_63::UMemory::operator_delete((UMemory *)this,pcVar9);
  pUVar3 = (UnicodeSetStringSpan *)gCurrSymbolsEquiv;
LAB_002b04d9:
  gCurrSymbolsEquiv = (Hashtable *)pUVar3;
  icu_63::umtx_initImplPostInit(&gCurrSymbolsEquivInitOnce);
  return gCurrSymbolsEquiv;
}

Assistant:

static void cleanup(void) {
        while (gCRegHead) {
            CReg* n = gCRegHead;
            gCRegHead = gCRegHead->next;
            delete n;
        }
    }